

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_display.cpp
# Opt level: O2

Point __thiscall cppurses::Text_display::display_position(Text_display *this,size_t index)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  Point PVar4;
  
  sVar1 = line_at(this,index);
  if (sVar1 < this->top_line_) {
    sVar1 = 0;
    sVar2 = 0;
  }
  else {
    sVar2 = bottom_line(this);
    if (sVar2 < sVar1) {
      index = last_index_at(this,sVar2);
      sVar1 = sVar2;
    }
    else {
      uVar3 = ((long)(this->contents_).
                     super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>.
                     super__Vector_base<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(this->contents_).
                    super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>.
                    super__Vector_base<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x18;
      if (uVar3 < index) {
        index = uVar3;
      }
    }
    sVar2 = sVar1 - this->top_line_;
    sVar1 = first_index_at(this,sVar1);
    sVar1 = index - sVar1;
  }
  PVar4.y = sVar2;
  PVar4.x = sVar1;
  return PVar4;
}

Assistant:

Point Text_display::display_position(std::size_t index) const {
    Point position;
    auto line = this->line_at(index);
    if (line < this->top_line()) {
        return position;
    }
    const auto last_shown_line = this->bottom_line();
    if (line > last_shown_line) {
        line = last_shown_line;
        index = this->last_index_at(line);
    } else if (index > this->contents().size()) {
        index = this->contents().size();
    }
    position.y = line - this->top_line();
    position.x = index - this->first_index_at(line);
    return position;
}